

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O0

void do_pardon(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  CHAR_DATA *txt;
  __type_conflict2 _Var2;
  CHAR_DATA *victim;
  char arg2 [4608];
  char arg1 [4608];
  CHAR_DATA *in_stack_ffffffffffffdbc8;
  char *in_stack_ffffffffffffdbd0;
  ulong uVar3;
  CHAR_DATA *in_stack_ffffffffffffdbd8;
  CHAR_DATA *ch_00;
  char *in_stack_ffffffffffffdbe0;
  char local_2418 [4608];
  char local_1218;
  char *in_stack_ffffffffffffffd0;
  CHAR_DATA *in_stack_ffffffffffffffd8;
  
  one_argument(in_stack_ffffffffffffdbd0,(char *)in_stack_ffffffffffffdbc8);
  one_argument(in_stack_ffffffffffffdbd0,(char *)in_stack_ffffffffffffdbc8);
  if ((local_1218 == '\0') || (local_2418[0] == '\0')) {
    send_to_char(in_stack_ffffffffffffdbe0,in_stack_ffffffffffffdbd8);
  }
  else {
    txt = get_char_world(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    if (txt == (CHAR_DATA *)0x0) {
      send_to_char((char *)0x0,in_stack_ffffffffffffdbd8);
    }
    else {
      bVar1 = is_npc(in_stack_ffffffffffffdbc8);
      if (bVar1) {
        send_to_char((char *)txt,in_stack_ffffffffffffdbd8);
      }
      else {
        bVar1 = str_cmp(local_2418,"killer");
        if (bVar1) {
          bVar1 = str_cmp(local_2418,"thief");
          if (bVar1) {
            send_to_char((char *)txt,in_stack_ffffffffffffdbd8);
          }
          else {
            uVar3 = txt->act[0];
            _Var2 = std::pow<int,int>(0,0x587f1c);
            if ((uVar3 & (long)_Var2) != 0) {
              _Var2 = std::pow<int,int>(0,0x587f3e);
              txt->act[0] = ((long)_Var2 ^ 0xffffffffffffffffU) & txt->act[0];
              send_to_char((char *)txt,in_stack_ffffffffffffdbd8);
              send_to_char((char *)txt,in_stack_ffffffffffffdbd8);
            }
          }
        }
        else {
          ch_00 = (CHAR_DATA *)txt->act[0];
          _Var2 = std::pow<int,int>(0,0x587e7b);
          if (((ulong)ch_00 & (long)_Var2) != 0) {
            _Var2 = std::pow<int,int>(0,0x587e9d);
            txt->act[0] = ((long)_Var2 ^ 0xffffffffffffffffU) & txt->act[0];
            send_to_char((char *)txt,ch_00);
            send_to_char((char *)txt,ch_00);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void do_pardon(CHAR_DATA *ch, char *argument)
{
	char arg1[MAX_INPUT_LENGTH];
	char arg2[MAX_INPUT_LENGTH];
	CHAR_DATA *victim;

	argument = one_argument(argument, arg1);
	argument = one_argument(argument, arg2);

	if (arg1[0] == '\0' || arg2[0] == '\0')
	{
		send_to_char("Syntax: pardon <character> <killer|thief>.\n\r", ch);
		return;
	}

	victim = get_char_world(ch, arg1);

	if (victim == nullptr)
	{
		send_to_char("They aren't here.\n\r", ch);
		return;
	}

	if (is_npc(victim))
	{
		send_to_char("Not on NPC's.\n\r", ch);
		return;
	}

	if (!str_cmp(arg2, "killer"))
	{
		if (IS_SET(victim->act, PLR_KILLER))
		{
			REMOVE_BIT(victim->act, PLR_KILLER);

			send_to_char("Killer flag removed.\n\r", ch);
			send_to_char("You are no longer a KILLER.\n\r", victim);
		}

		return;
	}

	if (!str_cmp(arg2, "thief"))
	{
		if (IS_SET(victim->act, PLR_THIEF))
		{
			REMOVE_BIT(victim->act, PLR_THIEF);

			send_to_char("Thief flag removed.\n\r", ch);
			send_to_char("You are no longer a THIEF.\n\r", victim);
		}

		return;
	}

	send_to_char("Syntax: pardon <character> <killer|thief>.\n\r", ch);
}